

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::
     RenderLineSegments<ImPlot::GetterXsYs<int>,ImPlot::GetterXsYRef<int>,ImPlot::TransformerLogLog>
               (GetterXsYs<int> *getter1,GetterXsYRef<int> *getter2,TransformerLogLog *transformer,
               ImDrawList *DrawList,float line_weight,ImU32 col)

{
  float *pfVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  ImPlotPlot *pIVar8;
  double dVar9;
  double dVar10;
  ImPlotContext *pIVar11;
  ImPlotContext *pIVar12;
  long lVar13;
  int iVar14;
  float fVar15;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_78;
  int local_6c;
  ImDrawList *local_68;
  ImPlotContext *local_60;
  undefined1 local_58 [8];
  GetterXsYRef<int> *local_50;
  TransformerLogLog *local_48;
  int local_40;
  ImU32 local_3c;
  float local_38;
  
  local_68 = DrawList;
  if (((GImPlot->CurrentPlot->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true))
  {
    local_40 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      local_40 = getter1->Count;
    }
    local_58 = (undefined1  [8])getter1;
    local_50 = getter2;
    local_48 = transformer;
    local_3c = col;
    local_38 = line_weight;
    RenderPrimitives<ImPlot::LineSegmentsRenderer<ImPlot::GetterXsYs<int>,ImPlot::GetterXsYRef<int>,ImPlot::TransformerLogLog>>
              ((LineSegmentsRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYRef<int>,_ImPlot::TransformerLogLog>
                *)local_58,DrawList,&GImPlot->CurrentPlot->PlotRect);
  }
  else {
    local_60 = GImPlot;
    local_6c = getter2->Count;
    if (getter1->Count < getter2->Count) {
      local_6c = getter1->Count;
    }
    if (0 < local_6c) {
      iVar14 = 0;
      do {
        pIVar11 = GImPlot;
        iVar7 = getter1->Count;
        lVar13 = (long)(((getter1->Offset + iVar14) % iVar7 + iVar7) % iVar7) *
                 (long)getter1->Stride;
        iVar7 = *(int *)((long)getter1->Ys + lVar13);
        dVar9 = log10((double)*(int *)((long)getter1->Xs + lVar13) /
                      (GImPlot->CurrentPlot->XAxis).Range.Min);
        dVar3 = pIVar11->LogDenX;
        pIVar8 = pIVar11->CurrentPlot;
        dVar4 = (pIVar8->XAxis).Range.Min;
        dVar5 = (pIVar8->XAxis).Range.Max;
        dVar10 = log10((double)iVar7 / pIVar8->YAxis[transformer->YAxis].Range.Min);
        pIVar12 = GImPlot;
        iVar7 = transformer->YAxis;
        pIVar8 = pIVar11->CurrentPlot;
        dVar6 = pIVar8->YAxis[iVar7].Range.Min;
        local_58._0_4_ =
             (undefined4)
             ((((double)(float)(dVar9 / dVar3) * (dVar5 - dVar4) + dVar4) -
              (pIVar8->XAxis).Range.Min) * pIVar11->Mx + (double)pIVar11->PixelRange[iVar7].Min.x);
        local_58._4_4_ =
             (float)((((double)(float)(dVar10 / pIVar11->LogDenY[iVar7]) *
                       (pIVar8->YAxis[iVar7].Range.Max - dVar6) + dVar6) - dVar6) *
                     pIVar11->My[iVar7] + (double)pIVar11->PixelRange[iVar7].Min.y);
        iVar7 = getter2->Count;
        dVar3 = getter2->YRef;
        dVar9 = log10((double)*(int *)((long)getter2->Xs +
                                      (long)(((getter2->Offset + iVar14) % iVar7 + iVar7) % iVar7) *
                                      (long)getter2->Stride) /
                      (GImPlot->CurrentPlot->XAxis).Range.Min);
        dVar4 = pIVar12->LogDenX;
        pIVar8 = pIVar12->CurrentPlot;
        dVar5 = (pIVar8->XAxis).Range.Min;
        dVar6 = (pIVar8->XAxis).Range.Max;
        dVar10 = log10(dVar3 / pIVar8->YAxis[transformer->YAxis].Range.Min);
        iVar7 = transformer->YAxis;
        pIVar8 = pIVar12->CurrentPlot;
        dVar3 = pIVar8->YAxis[iVar7].Range.Min;
        local_78.x = (float)((((double)(float)(dVar9 / dVar4) * (dVar6 - dVar5) + dVar5) -
                             (pIVar8->XAxis).Range.Min) * pIVar12->Mx +
                            (double)pIVar12->PixelRange[iVar7].Min.x);
        fVar15 = (float)((((double)(float)(dVar10 / pIVar12->LogDenY[iVar7]) *
                           (pIVar8->YAxis[iVar7].Range.Max - dVar3) + dVar3) - dVar3) *
                         pIVar12->My[iVar7] + (double)pIVar12->PixelRange[iVar7].Min.y);
        local_78.y = fVar15;
        pIVar8 = local_60->CurrentPlot;
        fVar2 = (float)local_58._4_4_;
        if (fVar15 <= (float)local_58._4_4_) {
          fVar2 = fVar15;
        }
        if ((fVar2 < (pIVar8->PlotRect).Max.y) &&
           (fVar2 = (float)(~-(uint)(fVar15 <= (float)local_58._4_4_) & (uint)fVar15 |
                           local_58._4_4_ & -(uint)(fVar15 <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar8->PlotRect).Min.y, *pfVar1 <= fVar2 && fVar2 != *pfVar1)) {
          fVar2 = (float)local_58._0_4_;
          if (local_78.x <= (float)local_58._0_4_) {
            fVar2 = local_78.x;
          }
          if ((fVar2 < (pIVar8->PlotRect).Max.x) &&
             (fVar2 = (float)(~-(uint)(local_78.x <= (float)local_58._0_4_) & (uint)local_78.x |
                             local_58._0_4_ & -(uint)(local_78.x <= (float)local_58._0_4_)),
             (pIVar8->PlotRect).Min.x <= fVar2 && fVar2 != (pIVar8->PlotRect).Min.x)) {
            ImDrawList::AddLine(local_68,(ImVec2 *)local_58,&local_78,col,line_weight);
          }
        }
        iVar14 = iVar14 + 1;
      } while (local_6c != iVar14);
    }
  }
  return;
}

Assistant:

inline void RenderLineSegments(const Getter1& getter1, const Getter2& getter2, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        int I = ImMin(getter1.Count, getter2.Count);
        for (int i = 0; i < I; ++i) {
            ImVec2 p1 = transformer(getter1(i));
            ImVec2 p2 = transformer(getter2(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
        }
    }
    else {
        RenderPrimitives(LineSegmentsRenderer<Getter1,Getter2,Transformer>(getter1, getter2, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}